

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynConstantSet * ParseConstantSet(ParseContext *ctx)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  SynIdentifier *pSVar5;
  undefined4 extraout_var_01;
  SynBase *pSVar6;
  undefined4 extraout_var_02;
  SynConstant *node;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  SynConstantSet *this;
  Lexeme *pLVar7;
  Lexeme *pLVar8;
  IntrusiveList<SynConstant> constantSet;
  IntrusiveList<SynConstant> local_68;
  SynBase *local_58;
  Lexeme *local_50;
  SynConstant *local_48;
  SynConstant *pSStack_40;
  undefined4 extraout_var_00;
  undefined4 extraout_var_03;
  undefined4 extraout_var_08;
  
  local_50 = ctx->currentLexeme;
  if (local_50->type != lex_const) {
    return (SynConstantSet *)0x0;
  }
  ctx->currentLexeme = local_50 + 1;
  local_58 = ParseType(ctx,(bool *)0x0,false);
  if (local_58 == (SynBase *)0x0) {
    anon_unknown.dwarf_16d1cf::Report
              (ctx,ctx->currentLexeme,"ERROR: type name expected after const");
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])();
    local_58 = (SynBase *)CONCAT44(extraout_var,iVar4);
    SynBase::SynBase(local_58,0,ctx->currentLexeme,ctx->currentLexeme);
    local_58->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6d38;
  }
  local_68.head = (SynConstant *)0x0;
  local_68.tail = (SynConstant *)0x0;
  pLVar8 = ctx->currentLexeme;
  bVar3 = anon_unknown.dwarf_16d1cf::CheckAt
                    (ctx,lex_string,"ERROR: constant name expected after type");
  pLVar7 = ctx->currentLexeme;
  if (bVar3) {
    pcVar2 = pLVar7->pos;
    uVar1 = pLVar7->length;
    if (pLVar7->type != lex_none) {
      ctx->currentLexeme = pLVar7 + 1;
    }
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    pSVar5 = (SynIdentifier *)CONCAT44(extraout_var_00,iVar4);
    if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_00224238;
    pLVar7 = ctx->currentLexeme + -1;
    SynBase::SynBase((SynBase *)pSVar5,4,pLVar7,pLVar7);
    (pSVar5->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
    (pSVar5->name).begin = pcVar2;
    (pSVar5->name).end = pcVar2 + uVar1;
  }
  else {
    if (pLVar7 <= ctx->firstLexeme) goto LAB_00224238;
    pLVar8 = pLVar7 + -1;
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    pSVar5 = (SynIdentifier *)CONCAT44(extraout_var_01,iVar4);
    (pSVar5->super_SynBase).typeID = 4;
    (pSVar5->super_SynBase).begin = (Lexeme *)0x0;
    (pSVar5->super_SynBase).end = (Lexeme *)0x0;
    (pSVar5->super_SynBase).pos.begin = (char *)0x0;
    (pSVar5->super_SynBase).pos.end = (char *)0x0;
    *(undefined8 *)((long)&(pSVar5->super_SynBase).pos.end + 2) = 0;
    *(undefined8 *)((long)&(pSVar5->super_SynBase).next + 2) = 0;
    (pSVar5->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
    (pSVar5->name).begin = (char *)0x0;
    (pSVar5->name).end = (char *)0x0;
  }
  anon_unknown.dwarf_16d1cf::CheckConsume(ctx,lex_set,"ERROR: \'=\' not found after constant name");
  pSVar6 = ParseTernaryExpr(ctx);
  if (pSVar6 == (SynBase *)0x0) {
    anon_unknown.dwarf_16d1cf::Report
              (ctx,ctx->currentLexeme,"ERROR: expression not found after \'=\'");
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])();
    pSVar6 = (SynBase *)CONCAT44(extraout_var_02,iVar4);
    SynBase::SynBase(pSVar6,0,ctx->currentLexeme,ctx->currentLexeme);
    pSVar6->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6d38;
  }
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
  node = (SynConstant *)CONCAT44(extraout_var_03,iVar4);
  if (ctx->firstLexeme < ctx->currentLexeme) {
    SynBase::SynBase((SynBase *)node,0x3a,pLVar8,ctx->currentLexeme + -1);
    (node->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f7c78;
    node->name = pSVar5;
    node->value = pSVar6;
    while( true ) {
      IntrusiveList<SynConstant>::push_back(&local_68,node);
      if (ctx->currentLexeme->type != lex_comma) break;
      pLVar7 = ctx->currentLexeme + 1;
      ctx->currentLexeme = pLVar7;
      bVar3 = anon_unknown.dwarf_16d1cf::CheckAt
                        (ctx,lex_string,"ERROR: constant name expected after \',\'");
      pLVar8 = ctx->currentLexeme;
      if (bVar3) {
        pcVar2 = pLVar8->pos;
        uVar1 = pLVar8->length;
        if (pLVar8->type != lex_none) {
          ctx->currentLexeme = pLVar8 + 1;
        }
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        pSVar5 = (SynIdentifier *)CONCAT44(extraout_var_04,iVar4);
        if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_00224238;
        pLVar8 = ctx->currentLexeme + -1;
        SynBase::SynBase((SynBase *)pSVar5,4,pLVar8,pLVar8);
        (pSVar5->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
        (pSVar5->name).begin = pcVar2;
        (pSVar5->name).end = pcVar2 + uVar1;
      }
      else {
        if (pLVar8 <= ctx->firstLexeme) goto LAB_00224238;
        pLVar7 = pLVar8 + -1;
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        pSVar5 = (SynIdentifier *)CONCAT44(extraout_var_05,iVar4);
        (pSVar5->super_SynBase).typeID = 4;
        (pSVar5->super_SynBase).begin = (Lexeme *)0x0;
        (pSVar5->super_SynBase).end = (Lexeme *)0x0;
        (pSVar5->super_SynBase).pos.begin = (char *)0x0;
        (pSVar5->super_SynBase).pos.end = (char *)0x0;
        *(undefined8 *)((long)&(pSVar5->super_SynBase).pos.end + 2) = 0;
        *(undefined8 *)((long)&(pSVar5->super_SynBase).next + 2) = 0;
        (pSVar5->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
        (pSVar5->name).begin = (char *)0x0;
        (pSVar5->name).end = (char *)0x0;
      }
      if (ctx->currentLexeme->type == lex_set) {
        ctx->currentLexeme = ctx->currentLexeme + 1;
        pSVar6 = ParseTernaryExpr(ctx);
        if (pSVar6 == (SynBase *)0x0) {
          anon_unknown.dwarf_16d1cf::Report
                    (ctx,ctx->currentLexeme,"ERROR: expression not found after \'=\'");
          iVar4 = (*ctx->allocator->_vptr_Allocator[2])();
          pSVar6 = (SynBase *)CONCAT44(extraout_var_06,iVar4);
          SynBase::SynBase(pSVar6,0,ctx->currentLexeme,ctx->currentLexeme);
          pSVar6->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6d38;
        }
      }
      else {
        pSVar6 = (SynBase *)0x0;
      }
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      node = (SynConstant *)CONCAT44(extraout_var_07,iVar4);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_00224238;
      SynBase::SynBase((SynBase *)node,0x3a,pLVar7,ctx->currentLexeme + -1);
      (node->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f7c78;
      node->name = pSVar5;
      node->value = pSVar6;
    }
    anon_unknown.dwarf_16d1cf::CheckConsume
              (ctx,lex_semicolon,"ERROR: \';\' not found after constants");
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
    this = (SynConstantSet *)CONCAT44(extraout_var_08,iVar4);
    if (ctx->firstLexeme < ctx->currentLexeme) {
      local_48 = local_68.head;
      pSStack_40 = local_68.tail;
      SynBase::SynBase((SynBase *)this,0x3b,local_50,ctx->currentLexeme + -1);
      (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f80d8;
      this->type = local_58;
      (this->constants).head = local_48;
      (this->constants).tail = pSStack_40;
      return this;
    }
  }
LAB_00224238:
  __assert_fail("currentLexeme > firstLexeme",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                ,0x19c,"Lexeme *ParseContext::Previous()");
}

Assistant:

SynConstantSet* ParseConstantSet(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_const))
	{
		SynBase *type = ParseType(ctx);

		if(!type)
		{
			Report(ctx, ctx.Current(), "ERROR: type name expected after const");

			type = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		IntrusiveList<SynConstant> constantSet;

		Lexeme *pos = ctx.currentLexeme;

		SynIdentifier *nameIdentifier = NULL;

		if(CheckAt(ctx, lex_string, "ERROR: constant name expected after type"))
		{
			InplaceStr name = ctx.Consume();
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
		}
		else
		{
			pos = ctx.Previous();

			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());
		}

		CheckConsume(ctx, lex_set, "ERROR: '=' not found after constant name");

		SynBase *value = ParseTernaryExpr(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after '='");

			value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		constantSet.push_back(new (ctx.get<SynConstant>()) SynConstant(pos, ctx.Previous(), nameIdentifier, value));

		while(ctx.Consume(lex_comma))
		{
			pos = ctx.currentLexeme;

			if(CheckAt(ctx, lex_string, "ERROR: constant name expected after ','"))
			{
				InplaceStr name = ctx.Consume();
				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
			}
			else
			{
				pos = ctx.Previous();

				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());
			}

			value = NULL;

			if(ctx.Consume(lex_set))
			{
				value = ParseTernaryExpr(ctx);

				if(!value)
				{
					Report(ctx, ctx.Current(), "ERROR: expression not found after '='");

					value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
				}
			}

			constantSet.push_back(new (ctx.get<SynConstant>()) SynConstant(pos, ctx.Previous(), nameIdentifier, value));
		}

		CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after constants");

		return new (ctx.get<SynConstantSet>()) SynConstantSet(start, ctx.Previous(), type, constantSet);
	}

	return NULL;
}